

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O3

int mpp_buffer_get_fd_with_caller(MppBuffer buffer,char *caller)

{
  uint uVar1;
  undefined8 in_stack_ffffffffffffffd8;
  
  if (buffer == (MppBuffer)0x0) {
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_fd invalid NULL input from %s\n",(char *)0x0,caller);
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = *(uint *)((long)buffer + 0xa0);
    if ((int)uVar1 < 0) {
      _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,"fd >= 0",
                 "mpp_buffer_get_fd_with_caller",
                 CONCAT44((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),0xc2));
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
      _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_fd buffer %p fd %d from %s\n",(char *)0x0,buffer,
                 (ulong)uVar1,caller);
    }
  }
  return uVar1;
}

Assistant:

int mpp_buffer_get_fd_with_caller(MppBuffer buffer, const char *caller)
{
    if (NULL == buffer) {
        mpp_err("mpp_buffer_get_fd invalid NULL input from %s\n", caller);
        return -1;
    }

    MppBufferImpl *p = (MppBufferImpl*)buffer;
    int fd = p->info.fd;
    mpp_assert(fd >= 0);
    if (fd < 0)
        mpp_err("mpp_buffer_get_fd buffer %p fd %d from %s\n", buffer, fd, caller);

    return fd;
}